

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

QVariant * __thiscall
QFileSystemModel::headerData
          (QVariant *__return_storage_ptr__,QFileSystemModel *this,int section,
          Orientation orientation,int role)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char *c;
  char *s;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (role == 7) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      ::QVariant::QVariant(__return_storage_ptr__,1);
      return __return_storage_ptr__;
    }
    goto LAB_0056f8c7;
  }
  if (role == 1) {
    if (section != 0) {
LAB_0056f7ca:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QAbstractItemModel::headerData((int)__return_storage_ptr__,(Orientation)this,section);
        return __return_storage_ptr__;
      }
      goto LAB_0056f8c7;
    }
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)&local_38,0x10,1,Format_ARGB32_Premultiplied);
    QImage::fill((QImage *)&local_38,transparent);
    QImage::operator_cast_to_QVariant(__return_storage_ptr__,(QImage *)&local_38);
    QImage::~QImage((QImage *)&local_38);
  }
  else {
    if (orientation != Horizontal || role != 0) goto LAB_0056f7ca;
    local_38.d = (Data *)0x0;
    local_38.ptr = (char16_t *)0x0;
    local_38.size = 0;
    switch(section) {
    case 0:
      s = "Name";
      break;
    case 1:
      s = "Size";
      break;
    case 2:
      s = "Type";
      c = "All other platforms";
      goto LAB_0056f852;
    case 3:
      s = "Date Modified";
      break;
    default:
      (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
      *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
      goto LAB_0056f890;
    }
    c = (char *)0x0;
LAB_0056f852:
    tr((QString *)&local_58,s,c,-1);
    qVar3 = local_38.size;
    pcVar2 = local_38.ptr;
    pDVar1 = local_38.d;
    local_38.d = local_58.d;
    local_38.ptr = local_58.ptr;
    local_58.d = pDVar1;
    local_58.ptr = pcVar2;
    local_38.size = local_58.size;
    local_58.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_38);
LAB_0056f890:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
LAB_0056f8c7:
  __stack_chk_fail();
}

Assistant:

QVariant QFileSystemModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    switch (role) {
    case Qt::DecorationRole:
        if (section == 0) {
            // ### TODO oh man this is ugly and doesn't even work all the way!
            // it is still 2 pixels off
            QImage pixmap(16, 1, QImage::Format_ARGB32_Premultiplied);
            pixmap.fill(Qt::transparent);
            return pixmap;
        }
        break;
    case Qt::TextAlignmentRole:
        return Qt::AlignLeft;
    }

    if (orientation != Qt::Horizontal || role != Qt::DisplayRole)
        return QAbstractItemModel::headerData(section, orientation, role);

    QString returnValue;
    switch (section) {
    case QFileSystemModelPrivate::NameColumn:
        returnValue = tr("Name");
        break;
    case QFileSystemModelPrivate::SizeColumn:
        returnValue = tr("Size");
        break;
    case QFileSystemModelPrivate::TypeColumn:
        returnValue =
#ifdef Q_OS_MAC
                    tr("Kind", "Match OS X Finder");
#else
                    tr("Type", "All other platforms");
#endif
        break;
    // Windows   - Type
    // OS X      - Kind
    // Konqueror - File Type
    // Nautilus  - Type
    case QFileSystemModelPrivate::TimeColumn:
        returnValue = tr("Date Modified");
        break;
    default: return QVariant();
    }
    return returnValue;
}